

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O2

vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
* __thiscall
Parser::parse_labels
          (vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
           *__return_storage_ptr__,Parser *this,string *path)

{
  short sVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  pointer pvVar5;
  int iVar6;
  ostream *poVar7;
  uint uVar8;
  bool bVar9;
  undefined1 auVar10 [16];
  uint local_264 [3];
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  res;
  ifstream f;
  byte abStack_218 [488];
  
  res.
  super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  res.
  super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  res.
  super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::ifstream::ifstream(&f,(string *)path,_S_bin);
  if ((abStack_218[*(long *)(_f + -0x18)] & 5) == 0) {
    std::istream::read((char *)&f,(long)local_264);
    std::istream::read((char *)&f,(long)local_264);
    auVar10 = ZEXT716(CONCAT52(CONCAT41((int)(CONCAT34((int3)(CONCAT25((short)(((uint7)(byte)(
                                                  local_264[0] >> 0x18) << 0x30) >> 0x28),
                                                  CONCAT14((char)(local_264[0] >> 0x10),local_264[0]
                                                          )) >> 0x20),local_264[0]) >> 0x18),
                                        (char)(local_264[0] >> 8)),(ushort)(byte)local_264[0]) &
                      0xffffff00ffffff);
    auVar10 = pshuflw(auVar10,auVar10,0x1b);
    sVar1 = auVar10._0_2_;
    sVar2 = auVar10._2_2_;
    sVar3 = auVar10._4_2_;
    sVar4 = auVar10._6_2_;
    uVar8 = CONCAT13((0 < sVar4) * (sVar4 < 0x100) * auVar10[6] - (0xff < sVar4),
                     CONCAT12((0 < sVar3) * (sVar3 < 0x100) * auVar10[4] - (0xff < sVar3),
                              CONCAT11((0 < sVar2) * (sVar2 < 0x100) * auVar10[2] - (0xff < sVar2),
                                       (0 < sVar1) * (sVar1 < 0x100) * auVar10[0] - (0xff < sVar1)))
                    );
    local_264[0] = uVar8;
    if ((uVar8 != 10000) && (uVar8 != 60000)) {
      __assert_fail("count1 == 60000 || count1 == 10000",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Everglow123[P]NN/utils.cpp"
                    ,0x38,
                    "std::vector<std::vector<float>> Parser::parse_labels(const std::string &)");
    }
    std::
    vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
    ::reserve(&res,(ulong)uVar8);
    while (bVar9 = uVar8 != 0, uVar8 = uVar8 - 1, bVar9) {
      local_264[2] = 10;
      local_264[1] = 0;
      std::
      vector<std::vector<float,std::allocator<float>>,std::allocator<std::vector<float,std::allocator<float>>>>
      ::emplace_back<int,int>
                ((vector<std::vector<float,std::allocator<float>>,std::allocator<std::vector<float,std::allocator<float>>>>
                  *)&res,(int *)(local_264 + 2),(int *)(local_264 + 1));
      pvVar5 = res.
               super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      iVar6 = std::istream::get();
      pvVar5[-1].super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start[iVar6] = 1.0;
    }
    std::ifstream::close();
    (__return_storage_ptr__->
    super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
    )._M_impl.super__Vector_impl_data._M_start =
         res.
         super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    (__return_storage_ptr__->
    super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
    )._M_impl.super__Vector_impl_data._M_finish =
         res.
         super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    (__return_storage_ptr__->
    super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage =
         res.
         super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    res.
    super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    res.
    super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    res.
    super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  else {
    poVar7 = std::operator<<((ostream *)&std::cerr,"unable to open: ");
    poVar7 = std::operator<<(poVar7,(string *)path);
    std::endl<char,std::char_traits<char>>(poVar7);
    (__return_storage_ptr__->
    super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
    )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
    )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  std::ifstream::~ifstream(&f);
  std::
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ::~vector(&res);
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::vector<float>> Parser::parse_labels(const std::string& path) {
    using namespace std;
    std::vector<std::vector<float>> res;
    ifstream f(path, ios::binary);
    if (!f) {
        cerr << "unable to open: " << path << endl;
        return {};
    }
    char bytes[4];
    f.read(bytes, 4);
    f.read(bytes, 4);
    Parser::big_to_little(bytes);
    int count1;
    count1 = *(reinterpret_cast<int*>(bytes));

    assert(count1 == 60000 || count1 == 10000);
    res.reserve(count1);
    for (int i = 0; i < count1; ++i) {
        res.emplace_back(10, 0);
        res.back()[f.get()] = 1;
    }
    f.close();
    return res;
}